

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * Catch::toString(string *__return_storage_ptr__,string *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  string *psVar4;
  char cVar5;
  long *plVar6;
  undefined8 *puVar7;
  char *pcVar8;
  ulong *puVar9;
  size_type *psVar10;
  ulong uVar11;
  ulong uVar12;
  string subs;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  ulong *local_d8;
  long local_d0;
  ulong local_c8 [2];
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  long lStack_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  long *local_78;
  undefined8 local_70;
  long local_68;
  undefined8 uStack_60;
  string *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  pcVar2 = (value->_M_dataplus)._M_p;
  local_58 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar2,pcVar2 + value->_M_string_length);
  if ((anonymous_namespace)::g_globalRunContext == (long *)0x0) {
    plVar6 = (long *)0x0;
  }
  else {
    plVar6 = (long *)(**(code **)(*(anonymous_namespace)::g_globalRunContext + 0x60))();
  }
  if (((plVar6 != (long *)0x0) && (cVar5 = (**(code **)(*plVar6 + 0x58))(plVar6), cVar5 != '\0')) &&
     (local_98._M_string_length != 0)) {
    paVar1 = &local_f8.field_2;
    uVar12 = 0;
    do {
      local_f8._M_string_length = 0;
      local_f8.field_2._M_local_buf[0] = '\0';
      cVar5 = local_98._M_dataplus._M_p[uVar12];
      local_f8._M_dataplus._M_p = (pointer)paVar1;
      if (cVar5 == '\t') {
        pcVar8 = "\\t";
LAB_0012efbc:
        std::__cxx11::string::_M_replace((ulong)&local_f8,0,(char *)0x0,(ulong)pcVar8);
      }
      else {
        if (cVar5 == '\n') {
          pcVar8 = "\\n";
          goto LAB_0012efbc;
        }
        pcVar8 = "\\r";
        if (cVar5 == '\r') goto LAB_0012efbc;
      }
      if (local_f8._M_string_length != 0) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)&local_98);
        plVar6 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_50,(ulong)local_f8._M_dataplus._M_p);
        puVar9 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar9) {
          local_a8 = *puVar9;
          lStack_a0 = plVar6[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *puVar9;
          local_b8 = (ulong *)*plVar6;
        }
        local_b0 = plVar6[1];
        *plVar6 = (long)puVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        uVar12 = uVar12 + 1;
        std::__cxx11::string::substr((ulong)&local_d8,(ulong)&local_98);
        uVar11 = 0xf;
        if (local_b8 != &local_a8) {
          uVar11 = local_a8;
        }
        if (uVar11 < (ulong)(local_d0 + local_b0)) {
          uVar11 = 0xf;
          if (local_d8 != local_c8) {
            uVar11 = local_c8[0];
          }
          if (uVar11 < (ulong)(local_d0 + local_b0)) goto LAB_0012f0a1;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_b8);
        }
        else {
LAB_0012f0a1:
          puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_d8);
        }
        plVar6 = puVar7 + 2;
        if ((long *)*puVar7 == plVar6) {
          local_68 = *plVar6;
          uStack_60 = puVar7[3];
          local_78 = &local_68;
        }
        else {
          local_68 = *plVar6;
          local_78 = (long *)*puVar7;
        }
        local_70 = puVar7[1];
        *puVar7 = plVar6;
        puVar7[1] = 0;
        *(undefined1 *)plVar6 = 0;
        std::__cxx11::string::operator=((string *)&local_98,(string *)&local_78);
        if (local_78 != &local_68) {
          operator_delete(local_78,local_68 + 1);
        }
        if (local_d8 != local_c8) {
          operator_delete(local_d8,local_c8[0] + 1);
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p,
                        CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                 local_f8.field_2._M_local_buf[0]) + 1);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < local_98._M_string_length);
  }
  std::operator+(&local_f8,"\"",&local_98);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
  psVar4 = local_58;
  (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
  psVar10 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar10) {
    lVar3 = plVar6[3];
    (local_58->field_2)._M_allocated_capacity = *psVar10;
    *(long *)((long)&local_58->field_2 + 8) = lVar3;
  }
  else {
    (local_58->_M_dataplus)._M_p = (pointer)*plVar6;
    (local_58->field_2)._M_allocated_capacity = *psVar10;
  }
  local_58->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,
                    CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                             local_f8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return psVar4;
}

Assistant:

std::string toString( std::string const& value ) {
    std::string s = value;
    IConfig const* config = getGlobalConfig();
    if( config && config->showInvisibles() ) {
        for(size_t i = 0; i < s.size(); ++i ) {
            std::string subs;
            switch( s[i] ) {
            case '\r': subs = "\\r"; break;
            case '\n': subs = "\\n"; break;
            case '\t': subs = "\\t"; break;
            default: break;
            }
            if( !subs.empty() ) {
                s = s.substr( 0, i ) + subs + s.substr( i+1 );
                ++i;
            }
        }
    }
    return "\"" + s + "\"";
}